

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
::computeMinMax(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>,_nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Adaptor<float,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_float,_unsigned_int>,_eos::fitting::KDTreeVectorOfVectorsAdaptor<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_float,_2,_nanoflann::metric_L2,_unsigned_long>,_2,_unsigned_long>
                      *obj,Offset ind,Size count,Dimension element,ElementType *min_elem,
               ElementType *max_elem)

{
  float fVar1;
  pointer puVar2;
  pointer pMVar3;
  Size SVar4;
  float fVar5;
  
  if ((uint)element < 2) {
    puVar2 = (this->vAcc).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar3 = (obj->dataset->m_data->
             super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    fVar5 = *(float *)((long)&pMVar3[puVar2[ind]].
                              super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
                              m_data + (ulong)(uint)element * 4);
    *min_elem = fVar5;
    *max_elem = fVar5;
    if (1 < count) {
      SVar4 = 1;
      do {
        fVar1 = *(float *)((long)&pMVar3[puVar2[ind + SVar4]].
                                  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                                  m_storage.m_data + (ulong)(uint)element * 4);
        if (fVar1 < *min_elem) {
          *min_elem = fVar1;
          fVar5 = *max_elem;
        }
        if (fVar5 < fVar1) {
          *max_elem = fVar1;
          fVar5 = fVar1;
        }
        SVar4 = SVar4 + 1;
      } while (count != SVar4);
    }
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xa3,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, 2, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<float, 2, 1>, Level = 0]"
               );
}

Assistant:

void computeMinMax(
        const Derived& obj, Offset ind, Size count, Dimension element,
        ElementType& min_elem, ElementType& max_elem)
    {
        min_elem = dataset_get(obj, vAcc[ind], element);
        max_elem = min_elem;
        for (Offset i = 1; i < count; ++i)
        {
            ElementType val = dataset_get(obj, vAcc[ind + i], element);
            if (val < min_elem) min_elem = val;
            if (val > max_elem) max_elem = val;
        }
    }